

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_back_Test::TestBody(string_view_back_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_30.ss_.ptr_._0_1_ = 0x73;
  testing::internal::CmpHelperEQ<char,char>(local_28,"\'s\'","sv.back()",(char *)&local_30,"s");
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0xae,message);
    testing::internal::AssertHelper::operator=(&local_18,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_30.ss_.ptr_._1_7_,local_30.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, back) {
  string_view sv("words");
  ASSERT_EQ('s', sv.back());
}